

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectModel.cpp
# Opt level: O3

Oop __thiscall Lodtalk::VMContext::setGlobalVariable(VMContext *this,char *name,Oop value)

{
  Oop symbol;
  anon_union_8_4_0eb573b0_for_Oop_0 aVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,name,&local_39);
  symbol = ByteSymbol::fromNative(this,&local_38);
  aVar1 = (anon_union_8_4_0eb573b0_for_Oop_0)setGlobalVariable(this,symbol,value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return (Oop)aVar1.pointer;
}

Assistant:

Oop VMContext::setGlobalVariable(const char *name, Oop value)
{
	return setGlobalVariable(ByteSymbol::fromNative(this, name), value);
}